

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

PixelSensor *
pbrt::PixelSensor::Create
          (ParameterDictionary *parameters,RGBColorSpace *colorSpace,Float exposureTime,FileLoc *loc
          ,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  PixelSensor *this;
  undefined4 extraout_var_00;
  float imagingRatio;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  string sensorName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  SpectrumHandle b;
  SpectrumHandle g;
  SpectrumHandle r;
  string local_e0;
  string local_c0;
  Float local_9c;
  Float local_98;
  Float local_94;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  undefined1 local_78 [16];
  FileLoc *local_60;
  string local_58;
  SpectrumHandle local_38;
  undefined4 extraout_var;
  
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"fnumber","");
  local_94 = ParameterDictionary::GetOneFloat(parameters,&local_e0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"iso","");
  local_98 = ParameterDictionary::GetOneFloat(parameters,&local_e0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"c","");
  local_9c = ParameterDictionary::GetOneFloat(parameters,&local_e0,314.15927);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"whitebalance","");
  local_78._0_4_ = ParameterDictionary::GetOneFloat(parameters,&local_e0,0.0);
  local_78._4_4_ = extraout_XMM0_Db;
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._12_4_ = extraout_XMM0_Dd;
  local_60 = loc;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"sensor","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"cie1931","");
  ParameterDictionary::GetOneString(&local_e0,parameters,&local_c0,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_e0);
  uVar3 = vcmpss_avx512f(local_78,ZEXT816(0) << 0x40,0);
  bVar4 = (bool)((byte)uVar3 & 1);
  local_78._0_4_ =
       (uint)bVar4 * ((uint)(iVar5 != 0) * 0x45cb2000 + (uint)(iVar5 == 0) * local_78._0_4_) +
       (uint)!bVar4 * local_78._0_4_;
  imagingRatio = (exposureTime * 3.1415927 * local_98 * 683.0) / (local_94 * local_94 * local_9c);
  iVar5 = std::__cxx11::string::compare((char *)&local_e0);
  if (iVar5 == 0) {
    iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0xa8,8);
    this = (PixelSensor *)CONCAT44(extraout_var_00,iVar5);
    PixelSensor(this,colorSpace,(Float)local_78._0_4_,imagingRatio,alloc);
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
    std::__cxx11::string::append((char *)&local_c0);
    GetNamedSpectrum((pbrt *)&local_80,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
    std::__cxx11::string::append((char *)&local_c0);
    GetNamedSpectrum((pbrt *)&local_88,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
    std::__cxx11::string::append((char *)&local_c0);
    GetNamedSpectrum((pbrt *)&local_90,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (((((ulong)local_80 & 0xffffffffffff) == 0) || (((ulong)local_88 & 0xffffffffffff) == 0)) ||
       ((local_90.bits & 0xffffffffffff) == 0)) {
      ErrorExit<std::__cxx11::string&>(local_60,"%s: unknown sensor type",&local_e0);
    }
    iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0xa8,8);
    this = (PixelSensor *)CONCAT44(extraout_var,iVar5);
    local_c0._M_dataplus._M_p = (pointer)local_80;
    local_58._M_dataplus._M_p = (pointer)local_88;
    local_38.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )local_90.bits;
    PixelSensor(this,(SpectrumHandle *)&local_c0,(SpectrumHandle *)&local_58,&local_38,colorSpace,
                (Float)local_78._0_4_,imagingRatio,alloc);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

PixelSensor *PixelSensor::Create(const ParameterDictionary &parameters,
                                 const RGBColorSpace *colorSpace, Float exposureTime,
                                 const FileLoc *loc, Allocator alloc) {
    // Imaging ratio parameters
    // The defaults here represent a "passthrough" setup such that the imaging
    // ratio will be exactly 1. This is a useful default since scenes that
    // weren't authored with a physical camera in mind will render as expected.
    Float fNumber = parameters.GetOneFloat("fnumber", 1.);
    Float ISO = parameters.GetOneFloat("iso", 100.);
    // Note: in the talk we mention using 312.5 for historical reasons. The
    // choice of 100 * Pi here just means that the other parameters make nice
    // "round" numbers like 1 and 100.
    Float C = parameters.GetOneFloat("c", 100.0 * Pi);
    Float whiteBalanceTemp = parameters.GetOneFloat("whitebalance", 0);

    std::string sensorName = parameters.GetOneString("sensor", "cie1931");

    // Pass through 0 for cie1931 if it's unspecified so that it doesn't do
    // any white balancing. For actual sensors, 6500 is the default...
    if (sensorName != "cie1931" && whiteBalanceTemp == 0)
        whiteBalanceTemp = 6500;

    Float imagingRatio = Pi * exposureTime * ISO * K_m / (C * fNumber * fNumber);

    if (sensorName == "cie1931") {
        return alloc.new_object<PixelSensor>(colorSpace, whiteBalanceTemp, imagingRatio,
                                             alloc);
    } else {
        SpectrumHandle r = GetNamedSpectrum(sensorName + "_r");
        SpectrumHandle g = GetNamedSpectrum(sensorName + "_g");
        SpectrumHandle b = GetNamedSpectrum(sensorName + "_b");

        if (!r || !g || !b)
            ErrorExit(loc, "%s: unknown sensor type", sensorName);

        return alloc.new_object<PixelSensor>(r, g, b, colorSpace, whiteBalanceTemp,
                                             imagingRatio, alloc);
    }
}